

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool IsValidVertexEdgeLink
               (ON_SubDVertex *vertex,ON_SubDEdge *edge,ON__UINT_PTR end_index,bool bSilentError)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  double edge_sector_coefficient;
  double expected_sector_coefficient;
  ON_SubDSectorType st;
  uint tagged_end_index;
  bool bSilentError_local;
  ON__UINT_PTR end_index_local;
  ON_SubDEdge *edge_local;
  ON_SubDVertex *vertex_local;
  
  st.m_corner_sector_angle_radians._7_1_ = bSilentError;
  if ((vertex == (ON_SubDVertex *)0x0) || (edge == (ON_SubDEdge *)0x0)) {
    vertex_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
  else if (end_index < 2) {
    if (edge->m_vertex[end_index] == vertex) {
      uVar2 = ON_SubDComponentBase::SubdivisionLevel(&vertex->super_ON_SubDComponentBase);
      uVar3 = ON_SubDComponentBase::SubdivisionLevel(&edge->super_ON_SubDComponentBase);
      if (uVar2 == uVar3) {
        bVar1 = EdgeSectorCoefficientIsValid(edge->m_sector_coefficient[end_index],edge);
        if (bVar1) {
          bVar1 = ON_SubDEdge::IsSmooth(edge);
          if (bVar1) {
            if (vertex->m_vertex_tag == Smooth) {
              if (edge->m_sector_coefficient[end_index] != 0.0) {
                bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
                return bVar1;
              }
            }
            else {
              st.m_corner_sector_angle_radians._0_4_ = ON_SubDEdge::TaggedEndIndex(edge);
              if (edge->m_edge_tag == SmoothX) {
                if (st.m_corner_sector_angle_radians._0_4_ != 2) {
                  bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
                  return bVar1;
                }
              }
              else if (st.m_corner_sector_angle_radians._0_4_ != (uint)end_index) {
                bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
                return bVar1;
              }
              ON_SubDSectorType::Create
                        ((ON_SubDSectorType *)&expected_sector_coefficient,edge,(uint)end_index);
              bVar1 = ON_SubDSectorType::IsValid((ON_SubDSectorType *)&expected_sector_coefficient);
              if (!bVar1) {
                bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
                return bVar1;
              }
              edge_sector_coefficient =
                   ON_SubDSectorType::SectorCoefficient
                             ((ON_SubDSectorType *)&expected_sector_coefficient);
              if (edge_sector_coefficient != edge->m_sector_coefficient[end_index]) {
                bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
                return bVar1;
              }
              bVar1 = EdgeSectorCoefficientIsSet(edge_sector_coefficient);
              if (!bVar1) {
                bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
                return bVar1;
              }
            }
          }
          else {
            if (edge->m_edge_tag != Crease) {
              bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
              return bVar1;
            }
            if ((edge->m_sector_coefficient[end_index] != 0.0) ||
               (NAN(edge->m_sector_coefficient[end_index]))) {
              bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
              return bVar1;
            }
            if (vertex->m_vertex_tag == Smooth) {
              bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
              return bVar1;
            }
            if (vertex->m_vertex_tag == Unset) {
              bVar1 = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
              return bVar1;
            }
          }
          vertex_local._7_1_ = true;
        }
        else {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1))
          ;
        }
      }
      else {
        vertex_local._7_1_ = ON_SubDIsNotValid((bool)(st.m_corner_sector_angle_radians._7_1_ & 1));
      }
    }
    else {
      vertex_local._7_1_ = ON_SubDIsNotValid(bSilentError);
    }
  }
  else {
    vertex_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
  return vertex_local._7_1_;
}

Assistant:

static bool IsValidVertexEdgeLink(
  const ON_SubDVertex* vertex,
  const ON_SubDEdge* edge,
  ON__UINT_PTR end_index,
  bool bSilentError
)
{
  if (nullptr == vertex || nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (end_index > 1)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->m_vertex[end_index] != vertex)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->SubdivisionLevel() != edge->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  if (false == EdgeSectorCoefficientIsValid(edge->m_sector_coefficient[end_index],edge))
    return ON_SubDIsNotValid(bSilentError);

  if ( edge->IsSmooth() )
  {
    // edge->m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
    {
      if (false == (0.0 == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);
    }
    else
    {
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (ON_SubDEdgeTag::SmoothX == edge->m_edge_tag)
      {
        if (2 != tagged_end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
      else
      {
        if (tagged_end_index != (unsigned int)end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
       
      ON_SubDSectorType st = ON_SubDSectorType::Create(edge,(unsigned int)end_index);
      if (!st.IsValid())
        return ON_SubDIsNotValid(bSilentError);

      const double expected_sector_coefficient = st.SectorCoefficient();
      if (false == (expected_sector_coefficient == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);

      if (false == EdgeSectorCoefficientIsSet(expected_sector_coefficient))
        return ON_SubDIsNotValid(bSilentError);
    }
  }
  else if(ON_SubDEdgeTag::Crease == edge->m_edge_tag)
  {
    // crease edge
    if (!(0.0 == edge->m_sector_coefficient[end_index]))
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Unset == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  return true;
}